

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcSlabType::IfcSlabType(IfcSlabType *this)

{
  IfcSlabType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1c0,"IfcSlabType");
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__00fd9290);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>,
             &PTR_construction_vtable_24__00fd93c8);
  *(undefined8 *)this = 0xfd9160;
  *(undefined8 *)&this->field_0x1c0 = 0xfd9278;
  *(undefined8 *)&this->field_0x88 = 0xfd9188;
  *(undefined8 *)&this->field_0x98 = 0xfd91b0;
  *(undefined8 *)&this->field_0xf0 = 0xfd91d8;
  *(undefined8 *)&this->field_0x148 = 0xfd9200;
  *(undefined8 *)&this->field_0x180 = 0xfd9228;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0xfd9250;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>).field_0x10);
  return;
}

Assistant:

IfcSlabType() : Object("IfcSlabType") {}